

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

Result emulator_read_state(Emulator *e,FileData *file_data)

{
  undefined8 uVar1;
  int i_1;
  int i;
  long lVar2;
  PaletteRGBA *pPVar3;
  int pal;
  long lVar4;
  
  if (file_data->size == 0x30bc0) {
    if (*(int *)file_data->data == 0x6b57a7e2) {
      memcpy(&e->state,file_data->data,0x30bc0);
      set_cart_info(e,(e->state).cart_info_index);
      if ((e->state).is_sgb != FALSE) {
        uVar1 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
        *(undefined8 *)e->color_to_rgba[1].color = *(undefined8 *)(e->state).sgb.screen_pal[0].color
        ;
        *(undefined8 *)(e->color_to_rgba[1].color + 2) = uVar1;
        lVar2 = 0;
        do {
          e->pal[1].color[lVar2] = e->color_to_rgba[1].color[(e->state).ppu.pal[1].color[lVar2]];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        uVar1 = *(undefined8 *)((e->state).sgb.screen_pal[0].color + 2);
        *(undefined8 *)e->color_to_rgba[2].color = *(undefined8 *)(e->state).sgb.screen_pal[0].color
        ;
        *(undefined8 *)(e->color_to_rgba[2].color + 2) = uVar1;
        lVar2 = 0;
        do {
          e->sgb_pal[-1].color[lVar2] =
               e->pal[-1].color[*(uint *)((long)((e->state).ppu.bgcp.palettes + -1) + lVar2 * 4)];
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
      }
      lVar2 = 0;
      do {
        e->pal[0].color[lVar2] = e->color_to_rgba[0].color[(e->state).ppu.pal[0].color[lVar2]];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pPVar3 = e->sgb_pal;
      lVar2 = 0;
      do {
        lVar4 = 0;
        do {
          pPVar3->color[lVar4] =
               (e->state).sgb.screen_pal[lVar2].color[(e->state).ppu.pal[0].color[lVar4]];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        lVar2 = lVar2 + 1;
        pPVar3 = pPVar3 + 1;
      } while (lVar2 != 4);
      lVar2 = 0;
      do {
        e->pal[1].color[lVar2] = e->color_to_rgba[1].color[(e->state).ppu.pal[1].color[lVar2]];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar2 = 0;
      do {
        e->sgb_pal[-1].color[lVar2] =
             e->pal[-1].color[*(uint *)((long)((e->state).ppu.bgcp.palettes + -1) + lVar2 * 4)];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      return OK;
    }
    emulator_read_state_cold_2();
  }
  else {
    emulator_read_state_cold_1();
  }
  return ERROR;
}

Assistant:

Result emulator_read_state(Emulator* e, const FileData* file_data) {
  CHECK_MSG(file_data->size == sizeof(EmulatorState),
            "save state file is wrong size: %ld, expected %ld.\n",
            (long)file_data->size, (long)sizeof(EmulatorState));
  EmulatorState* new_state = (EmulatorState*)file_data->data;
  CHECK_MSG(new_state->header == SAVE_STATE_HEADER,
            "header mismatch: %u, expected %u.\n", new_state->header,
            SAVE_STATE_HEADER);
  memcpy(&e->state, new_state, sizeof(EmulatorState));
  set_cart_info(e, e->state.cart_info_index);

  if (IS_SGB) {
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP0, &SGB.screen_pal[0]);
    emulator_set_bw_palette(e, PALETTE_TYPE_OBP1, &SGB.screen_pal[0]);
  }
  update_bw_palette_rgba(e, PALETTE_TYPE_BGP);
  update_bw_palette_rgba(e, PALETTE_TYPE_OBP0);
  update_bw_palette_rgba(e, PALETTE_TYPE_OBP1);
  return OK;
  ON_ERROR_RETURN;
}